

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O0

void __thiscall
Assimp::IRRImporter::ComputeAnimations
          (IRRImporter *this,Node *root,aiNode *real,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *anims)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  aiString *paVar9;
  bool bVar10;
  uint uVar11;
  ai_uint32 aVar12;
  int size_00;
  int iVar13;
  Logger *pLVar14;
  reference pAVar15;
  aiNode *paVar16;
  long lVar17;
  ulong uVar18;
  aiNode **ppaVar19;
  float *pfVar20;
  aiQuatKey *paVar21;
  aiVector3t<float> *paVar22;
  size_type sVar23;
  ulong uVar24;
  aiVectorKey *paVar25;
  reference pvVar26;
  reference pvVar27;
  reference pvVar28;
  reference pvVar29;
  int idx_00;
  float fVar30;
  float fVar31;
  aiVector3t<float> aVar32;
  aiVectorKey *local_598;
  aiVectorKey *local_570;
  aiVectorKey *local_538;
  aiVectorKey *local_4d8;
  aiQuatKey *local_4b0;
  char *local_488;
  aiVector3t<float> local_438;
  aiVector3t<float> local_428;
  aiVector3t<float> local_418;
  aiVector3t<float> local_408;
  aiVector3t<float> local_3f8;
  aiVector3t<float> local_3e8;
  aiVector3t<float> local_3d8;
  aiVector3t<float> local_3c8;
  aiVector3t<float> local_3b8;
  aiVector3t<float> local_3a8;
  aiVector3t<float> local_398;
  double local_388;
  float local_380;
  aiVector3t<float> local_378;
  aiVector3t<float> local_368;
  aiVector3t<float> local_358;
  double local_348;
  aiVector3D t2;
  aiVector3t<float> local_318;
  undefined1 local_308 [8];
  aiVector3D t1;
  ai_real h4;
  ai_real h3;
  ai_real h2;
  ai_real h1;
  ai_real u3;
  ai_real u2;
  aiVector3D *p3;
  aiVector3D *p2;
  aiVector3D *p1;
  aiVector3D *p0;
  int idx;
  ai_real u;
  ai_real dt;
  aiVectorKey *key_2;
  uint i_4;
  uint ticksPerFull;
  int size;
  aiVector3t<float> local_278;
  double local_26c;
  float local_264;
  double *local_260;
  aiVectorKey *key_1;
  double dStack_250;
  uint i_3;
  double timeFactor;
  undefined8 uStack_240;
  ai_real lengthOfWay;
  float local_238;
  undefined1 local_22c [8];
  aiVector3D diff;
  double tdelta_1;
  double seconds_1;
  aiVector3t<float> local_1d0;
  aiVector3t<float> local_1c0;
  aiVector3t<float> local_1b0;
  aiVector3t<float> local_1a0;
  aiVector3t<float> local_190;
  double local_180;
  float local_178;
  float local_174;
  double *pdStack_170;
  ai_real t;
  aiVectorKey *key;
  undefined8 uStack_160;
  uint i_2;
  float local_158;
  aiVector3t<float> local_14c;
  aiVector3t<float> local_140;
  aiVector3t<float> local_130;
  aiVector3t<float> local_124;
  aiVector3t<float> local_118;
  aiVector3t<float> local_108;
  aiVector3t<float> local_fc;
  undefined1 local_f0 [8];
  aiVector3D vecV;
  aiVector3D vecU;
  double tdelta;
  double seconds;
  double dStack_c0;
  double *local_b8;
  aiQuatKey *q;
  undefined1 local_a8 [4];
  uint i_1;
  aiVector3D angle;
  float local_94;
  int local_90;
  float max;
  int lcm;
  int angles [3];
  uint i;
  aiNode *dummy;
  aiNodeAnim *anim;
  Animator *in;
  _Self local_50;
  iterator it_1;
  iterator iStack_40;
  uint cur;
  _Self local_38;
  iterator it;
  uint total;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *anims_local;
  aiNode *real_local;
  Node *root_local;
  IRRImporter *this_local;
  
  if (root != (Node *)0x0 && real != (aiNode *)0x0) {
    bVar10 = std::__cxx11::
             list<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>::
             empty(&root->animators);
    if (!bVar10) {
      it._M_node._4_4_ = 0;
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>::
           begin(&root->animators);
      while( true ) {
        iStack_40 = std::__cxx11::
                    list<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>
                    ::end(&root->animators);
        bVar10 = std::operator!=(&local_38,&stack0xffffffffffffffc0);
        if (!bVar10) break;
        pAVar15 = std::_List_iterator<Assimp::IRRImporter::Animator>::operator*(&local_38);
        if ((pAVar15->type == UNKNOWN) ||
           (pAVar15 = std::_List_iterator<Assimp::IRRImporter::Animator>::operator*(&local_38),
           pAVar15->type == OTHER)) {
          pLVar14 = DefaultLogger::get();
          Logger::warn(pLVar14,"IRR: Skipping unknown or unsupported animator");
        }
        else {
          it._M_node._4_4_ = it._M_node._4_4_ + 1;
        }
        std::_List_iterator<Assimp::IRRImporter::Animator>::operator++(&local_38);
      }
      if (it._M_node._4_4_ != 0) {
        if (it._M_node._4_4_ == 1) {
          pLVar14 = DefaultLogger::get();
          Logger::warn(pLVar14,"IRR: Adding dummy nodes to simulate multiple animators");
        }
        it_1._M_node._4_4_ = 0;
        local_50._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>::
             begin(&root->animators);
        while( true ) {
          in = (Animator *)
               std::__cxx11::
               list<Assimp::IRRImporter::Animator,_std::allocator<Assimp::IRRImporter::Animator>_>::
               end(&root->animators);
          bVar10 = std::operator!=(&local_50,(_Self *)&in);
          if (!bVar10) break;
          pAVar15 = std::_List_iterator<Assimp::IRRImporter::Animator>::operator*(&local_50);
          if ((pAVar15->type != UNKNOWN) &&
             (pAVar15 = std::_List_iterator<Assimp::IRRImporter::Animator>::operator*(&local_50),
             pAVar15->type != OTHER)) {
            anim = (aiNodeAnim *)
                   std::_List_iterator<Assimp::IRRImporter::Animator>::operator*(&local_50);
            paVar16 = (aiNode *)operator_new(0x438);
            aiNodeAnim::aiNodeAnim((aiNodeAnim *)paVar16);
            dummy = paVar16;
            if (it_1._M_node._4_4_ == it._M_node._4_4_ + -1) {
              aiString::Set((aiString *)paVar16,&root->name);
            }
            else {
              uVar11 = it._M_node._4_4_ - 1;
              lVar17 = std::__cxx11::string::length();
              if (lVar17 == 0) {
                local_488 = "";
              }
              else {
                local_488 = (char *)std::__cxx11::string::c_str();
              }
              aVar12 = snprintf((paVar16->mName).data,0x400,"$INST_DUMMY_%i_%s",(ulong)uVar11,
                                local_488);
              (dummy->mName).length = aVar12;
              paVar16 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(paVar16);
              for (angles[1] = 0; (uint)angles[1] < real->mParent->mNumChildren;
                  angles[1] = angles[1] + 1) {
                if (real->mParent->mChildren[(uint)angles[1]] == real) {
                  real->mParent->mChildren[(uint)angles[1]] = paVar16;
                }
              }
              paVar16->mParent = real->mParent;
              aiString::operator=((aiString *)paVar16,&dummy->mName);
              paVar16->mNumChildren = 1;
              auVar6 = ZEXT416(paVar16->mNumChildren) * ZEXT816(8);
              uVar18 = auVar6._0_8_;
              if (auVar6._8_8_ != 0) {
                uVar18 = 0xffffffffffffffff;
              }
              ppaVar19 = (aiNode **)operator_new__(uVar18);
              paVar16->mChildren = ppaVar19;
              *paVar16->mChildren = real;
              real->mParent = paVar16;
            }
            it_1._M_node._4_4_ = it_1._M_node._4_4_ + 1;
            switch((anim->mNodeName).length) {
            case 1:
              max = (float)((int)(*(float *)((anim->mNodeName).data + 4) * 100.0) % 0x168);
              lcm = (int)(*(float *)((anim->mNodeName).data + 8) * 100.0) % 0x168;
              angles[0] = (int)(*(float *)((anim->mNodeName).data + 0xc) * 100.0) % 0x168;
              if (((int)max * lcm != 0) && (lcm * angles[0] != 0)) {
                FindSuitableMultiple((int *)&max);
                FindSuitableMultiple(&lcm);
                FindSuitableMultiple(angles);
              }
              local_90 = 0x168;
              if (max != 0.0) {
                local_90 = Math::lcm<int>(0x168,(int)max);
              }
              if (lcm != 0) {
                local_90 = Math::lcm<int>(local_90,lcm);
              }
              if (angles[0] != 0) {
                local_90 = Math::lcm<int>(local_90,angles[0]);
              }
              if (local_90 != 0x168) {
                local_94 = 0.0;
                if (max != 0.0) {
                  local_94 = (float)local_90 / (float)(int)max;
                }
                if (lcm != 0) {
                  angle.z = (float)local_90 / (float)lcm;
                  pfVar20 = std::max<float>(&local_94,&angle.z);
                  local_94 = *pfVar20;
                }
                if (angles[0] != 0) {
                  angle.y = (float)local_90 / (float)angles[0];
                  pfVar20 = std::max<float>(&local_94,&angle.y);
                  local_94 = *pfVar20;
                }
                (dummy->mTransformation).a4 = (float)(long)((double)local_94 * this->fps);
                uVar18 = CONCAT44(0,(dummy->mTransformation).a4);
                auVar2._8_8_ = 0;
                auVar2._0_8_ = uVar18;
                uVar24 = SUB168(auVar2 * ZEXT816(0x18),0);
                if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
                  uVar24 = 0xffffffffffffffff;
                }
                paVar21 = (aiQuatKey *)operator_new__(uVar24);
                if (uVar18 != 0) {
                  local_4b0 = paVar21;
                  do {
                    aiQuatKey::aiQuatKey(local_4b0);
                    local_4b0 = local_4b0 + 1;
                  } while (local_4b0 != paVar21 + uVar18);
                }
                *(aiQuatKey **)&(dummy->mTransformation).b2 = paVar21;
                aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_a8);
                for (q._4_4_ = 0.0; (uint)q._4_4_ < (uint)(dummy->mTransformation).a4;
                    q._4_4_ = (float)((int)q._4_4_ + 1)) {
                  local_b8 = (double *)
                             (*(long *)&(dummy->mTransformation).b2 + (ulong)(uint)q._4_4_ * 0x18);
                  aiQuaterniont<float>::aiQuaterniont
                            ((aiQuaterniont<float> *)&seconds,(float)local_a8,(float)i_1,angle.x);
                  local_b8[1] = seconds;
                  local_b8[2] = dStack_c0;
                  *local_b8 = (double)(uint)q._4_4_;
                  aiVector3t<float>::operator+=
                            ((aiVector3t<float> *)local_a8,
                             (aiVector3t<float> *)((anim->mNodeName).data + 4));
                }
                (dummy->mTransformation).c4 = 4.2039e-45;
                (dummy->mTransformation).d1 = 4.2039e-45;
              }
              break;
            case 2:
              dVar8 = this->fps;
              (dummy->mTransformation).a1 =
                   (float)(long)(this->fps *
                                ((1.0 / (double)*(float *)(anim->mNodeName).data) / 1000.0));
              uVar18 = CONCAT44(0,(dummy->mTransformation).a1);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = uVar18;
              uVar24 = SUB168(auVar3 * ZEXT816(0x18),0);
              if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
                uVar24 = 0xffffffffffffffff;
              }
              paVar25 = (aiVectorKey *)operator_new__(uVar24);
              if (uVar18 != 0) {
                local_4d8 = paVar25;
                do {
                  aiVectorKey::aiVectorKey(local_4d8);
                  local_4d8 = local_4d8 + 1;
                } while (local_4d8 != paVar25 + uVar18);
              }
              *(aiVectorKey **)&(dummy->mTransformation).a2 = paVar25;
              aiVector3t<float>::aiVector3t((aiVector3t<float> *)&vecV.y);
              aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_f0);
              fVar30 = *(float *)((anim->mNodeName).data + 8);
              if ((fVar30 != 0.0) || (NAN(fVar30))) {
                aiVector3t<float>::aiVector3t(&local_108,50.0,0.0,0.0);
                aVar32 = operator^(&local_108,(aiVector3t<float> *)((anim->mNodeName).data + 4));
                local_118.z = aVar32.z;
                local_118._0_8_ = aVar32._0_8_;
                local_fc._0_8_ = local_118._0_8_;
                local_fc.z = local_118.z;
                local_f0 = (undefined1  [8])local_118._0_8_;
                vecV.x = local_118.z;
              }
              else {
                aiVector3t<float>::aiVector3t(&local_130,0.0,50.0,0.0);
                aVar32 = operator^(&local_130,(aiVector3t<float> *)((anim->mNodeName).data + 4));
                local_140.z = aVar32.z;
                local_140._0_8_ = aVar32._0_8_;
                local_124._0_8_ = local_140._0_8_;
                local_124.z = local_140.z;
                local_f0 = (undefined1  [8])local_140._0_8_;
                vecV.x = local_140.z;
              }
              aiVector3t<float>::Normalize((aiVector3t<float> *)local_f0);
              aVar32 = operator^((aiVector3t<float> *)local_f0,
                                 (aiVector3t<float> *)((anim->mNodeName).data + 4));
              local_158 = aVar32.z;
              uStack_160 = aVar32._0_8_;
              local_14c._0_8_ = uStack_160;
              local_14c.z = local_158;
              paVar22 = aiVector3t<float>::Normalize(&local_14c);
              vecV.y = paVar22->x;
              vecV.z = paVar22->y;
              for (key._4_4_ = 0.0; (uint)key._4_4_ < (uint)(dummy->mTransformation).a1;
                  key._4_4_ = (float)((int)key._4_4_ + 1)) {
                pdStack_170 = (double *)
                              (*(long *)&(dummy->mTransformation).a2 + (ulong)(uint)key._4_4_ * 0x18
                              );
                *pdStack_170 = (double)(uint)key._4_4_ * (1000.0 / dVar8);
                local_174 = (float)((double)*(float *)(anim->mNodeName).data * *pdStack_170);
                paVar9 = &anim->mNodeName;
                fVar30 = *(float *)((anim->mNodeName).data + 0x1c);
                dVar7 = std::cos((double)(ulong)(uint)local_174);
                aVar32 = ::operator*((aiVector3t<float> *)&vecV.y,SUB84(dVar7,0));
                local_1c0.z = aVar32.z;
                local_1c0._0_8_ = aVar32._0_8_;
                local_1b0._0_8_ = local_1c0._0_8_;
                local_1b0.z = local_1c0.z;
                dVar7 = std::sin((double)(ulong)(uint)local_174);
                aVar32 = ::operator*((aiVector3t<float> *)local_f0,SUB84(dVar7,0));
                local_1d0.z = aVar32.z;
                local_1d0._0_8_ = aVar32._0_8_;
                aVar32 = ::operator+(&local_1b0,&local_1d0);
                local_1a0.z = aVar32.z;
                local_1a0._0_8_ = aVar32._0_8_;
                aVar32 = ::operator*(fVar30,&local_1a0);
                local_190.z = aVar32.z;
                local_190._0_8_ = aVar32._0_8_;
                aVar32 = ::operator+((aiVector3t<float> *)(paVar9->data + 0x10),&local_190);
                local_178 = aVar32.z;
                local_180 = aVar32._0_8_;
                pdStack_170[1] = local_180;
                *(float *)(pdStack_170 + 2) = local_178;
              }
              (dummy->mTransformation).c4 = 4.2039e-45;
              (dummy->mTransformation).d1 = 4.2039e-45;
              break;
            case 3:
              fVar30 = (float)(((byte)(anim->mNodeName).data[0x3c] & 1) * 2 + 1);
              (dummy->mTransformation).c4 = fVar30;
              (dummy->mTransformation).d1 = fVar30;
              diff._4_8_ = 1000.0 / this->fps;
              (dummy->mTransformation).a1 =
                   (float)(long)(this->fps *
                                ((double)*(int *)((anim->mNodeName).data + 0x40) / 1000.0));
              uVar18 = CONCAT44(0,(dummy->mTransformation).a1);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar18;
              uVar24 = SUB168(auVar4 * ZEXT816(0x18),0);
              if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
                uVar24 = 0xffffffffffffffff;
              }
              paVar25 = (aiVectorKey *)operator_new__(uVar24);
              if (uVar18 != 0) {
                local_538 = paVar25;
                do {
                  aiVectorKey::aiVectorKey(local_538);
                  local_538 = local_538 + 1;
                } while (local_538 != paVar25 + uVar18);
              }
              *(aiVectorKey **)&(dummy->mTransformation).a2 = paVar25;
              aVar32 = ::operator-((aiVector3t<float> *)((anim->mNodeName).data + 4),
                                   (aiVector3t<float> *)((anim->mNodeName).data + 0x10));
              local_238 = aVar32.z;
              uStack_240 = aVar32._0_8_;
              local_22c = (undefined1  [8])uStack_240;
              diff.x = local_238;
              timeFactor._4_4_ = aiVector3t<float>::Length((aiVector3t<float> *)local_22c);
              aiVector3t<float>::Normalize((aiVector3t<float> *)local_22c);
              dStack_250 = (double)(timeFactor._4_4_ /
                                   (float)*(int *)((anim->mNodeName).data + 0x40));
              for (key_1._4_4_ = 0.0; (uint)key_1._4_4_ < (uint)(dummy->mTransformation).a1;
                  key_1._4_4_ = (float)((int)key_1._4_4_ + 1)) {
                local_260 = (double *)
                            (*(long *)&(dummy->mTransformation).a2 + (ulong)(uint)key_1._4_4_ * 0x18
                            );
                *local_260 = (double)(uint)key_1._4_4_ * (double)diff._4_8_;
                paVar9 = &anim->mNodeName;
                aVar32 = ::operator*((aiVector3t<float> *)local_22c,(float)(dStack_250 * *local_260)
                                    );
                local_278.z = aVar32.z;
                local_278._0_8_ = aVar32._0_8_;
                aVar32 = ::operator+((aiVector3t<float> *)(paVar9->data + 0x10),&local_278);
                local_264 = aVar32.z;
                local_26c = aVar32._0_8_;
                local_260[1] = local_26c;
                *(float *)(local_260 + 2) = local_264;
              }
              break;
            case 4:
              (dummy->mTransformation).c4 = 4.2039e-45;
              (dummy->mTransformation).d1 = 4.2039e-45;
              sVar23 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                                 ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                  ((anim->mNodeName).data + 0x24));
              size_00 = (int)sVar23;
              if (size_00 == 0) {
                pLVar14 = DefaultLogger::get();
                Logger::warn(pLVar14,"IRR: Spline animators with no points defined");
                paVar16 = dummy;
                if (dummy != (aiNode *)0x0) {
                  aiNodeAnim::~aiNodeAnim((aiNodeAnim *)dummy);
                  operator_delete(paVar16,0x438);
                }
                dummy = (aiNode *)0x0;
              }
              else if (size_00 == 1) {
                (dummy->mTransformation).a1 = 1.4013e-45;
                uVar18 = CONCAT44(0,(dummy->mTransformation).a1);
                auVar5._8_8_ = 0;
                auVar5._0_8_ = uVar18;
                uVar24 = SUB168(auVar5 * ZEXT816(0x18),0);
                if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
                  uVar24 = 0xffffffffffffffff;
                }
                paVar25 = (aiVectorKey *)operator_new__(uVar24);
                if (uVar18 != 0) {
                  local_570 = paVar25;
                  do {
                    aiVectorKey::aiVectorKey(local_570);
                    local_570 = local_570 + 1;
                  } while (local_570 != paVar25 + uVar18);
                }
                *(aiVectorKey **)&(dummy->mTransformation).a2 = paVar25;
                pvVar26 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                    ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                     ((anim->mNodeName).data + 0x24),0);
                lVar17 = *(long *)&(dummy->mTransformation).a2;
                *(undefined8 *)(lVar17 + 8) = *(undefined8 *)&pvVar26->mValue;
                *(float *)(lVar17 + 0x10) = (pvVar26->mValue).z;
                **(undefined8 **)&(dummy->mTransformation).a2 = 0;
              }
              else {
                (dummy->mTransformation).a1 = (float)(long)(this->fps * 15.0);
                uVar18 = CONCAT44(0,(dummy->mTransformation).a1);
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar18;
                uVar24 = SUB168(auVar6 * ZEXT816(0x18),0);
                if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
                  uVar24 = 0xffffffffffffffff;
                }
                paVar25 = (aiVectorKey *)operator_new__(uVar24);
                if (uVar18 != 0) {
                  local_598 = paVar25;
                  do {
                    aiVectorKey::aiVectorKey(local_598);
                    local_598 = local_598 + 1;
                  } while (local_598 != paVar25 + uVar18);
                }
                *(aiVectorKey **)&(dummy->mTransformation).a2 = paVar25;
                for (key_2._4_4_ = 0.0; (uint)key_2._4_4_ < (uint)(dummy->mTransformation).a1;
                    key_2._4_4_ = (float)((int)key_2._4_4_ + 1)) {
                  pdVar1 = (double *)
                           (*(long *)&(dummy->mTransformation).a2 + (ulong)(uint)key_2._4_4_ * 0x18)
                  ;
                  fVar30 = (float)(uint)key_2._4_4_ * *(float *)(anim->mNodeName).data * 0.001;
                  dVar8 = std::floor((double)(ulong)(uint)fVar30);
                  fVar31 = fVar30 - SUB84(dVar8,0);
                  dVar8 = std::floor((double)(ulong)(uint)fVar30);
                  idx_00 = (int)SUB84(dVar8,0) % size_00;
                  paVar9 = &anim->mNodeName;
                  iVar13 = ClampSpline(idx_00 + -1,size_00);
                  pvVar26 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                      ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                       (paVar9->data + 0x24),(long)iVar13);
                  paVar9 = &anim->mNodeName;
                  iVar13 = ClampSpline(idx_00,size_00);
                  pvVar27 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                      ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                       (paVar9->data + 0x24),(long)iVar13);
                  paVar9 = &anim->mNodeName;
                  iVar13 = ClampSpline(idx_00 + 1,size_00);
                  pvVar28 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                      ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                       (paVar9->data + 0x24),(long)iVar13);
                  paVar9 = &anim->mNodeName;
                  iVar13 = ClampSpline(idx_00 + 2,size_00);
                  pvVar29 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                      ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                                       (paVar9->data + 0x24),(long)iVar13);
                  fVar31 = fVar31 * fVar31;
                  fVar30 = fVar31 + fVar31;
                  t1.z = fVar30 - fVar31;
                  aVar32 = ::operator-(&pvVar28->mValue,&pvVar26->mValue);
                  local_318.z = aVar32.z;
                  local_318._0_8_ = aVar32._0_8_;
                  aVar32 = ::operator*(&local_318,*(float *)((anim->mNodeName).data + 0x20));
                  t1.x = aVar32.z;
                  unique0x1000039b = aVar32._0_8_;
                  local_308 = (undefined1  [8])unique0x1000039b;
                  aVar32 = ::operator-(&pvVar29->mValue,&pvVar27->mValue);
                  local_368.z = aVar32.z;
                  local_368._0_8_ = aVar32._0_8_;
                  local_358._0_8_ = local_368._0_8_;
                  local_358.z = local_368.z;
                  aVar32 = ::operator*(&local_358,*(float *)((anim->mNodeName).data + 0x20));
                  local_378.z = aVar32.z;
                  local_378._0_8_ = aVar32._0_8_;
                  local_348 = (double)local_378._0_8_;
                  t2.x = local_378.z;
                  aVar32 = ::operator*(((fVar30 + fVar30) - fVar31 * 3.0) + 1.0,&pvVar27->mValue);
                  local_3c8.z = aVar32.z;
                  local_3c8._0_8_ = aVar32._0_8_;
                  local_3b8._0_8_ = local_3c8._0_8_;
                  local_3b8.z = local_3c8.z;
                  aVar32 = ::operator*(&pvVar28->mValue,fVar30 * 3.0 - (fVar30 + fVar30));
                  local_3e8.z = aVar32.z;
                  local_3e8._0_8_ = aVar32._0_8_;
                  local_3d8._0_8_ = local_3e8._0_8_;
                  local_3d8.z = local_3e8.z;
                  aVar32 = ::operator+(&local_3b8,&local_3d8);
                  local_3f8.z = aVar32.z;
                  local_3f8._0_8_ = aVar32._0_8_;
                  local_3a8._0_8_ = local_3f8._0_8_;
                  local_3a8.z = local_3f8.z;
                  aVar32 = ::operator*((aiVector3t<float> *)local_308,fVar30 - (fVar30 + fVar30));
                  local_418.z = aVar32.z;
                  local_418._0_8_ = aVar32._0_8_;
                  local_408._0_8_ = local_418._0_8_;
                  local_408.z = local_418.z;
                  aVar32 = ::operator+(&local_3a8,&local_408);
                  local_428.z = aVar32.z;
                  local_428._0_8_ = aVar32._0_8_;
                  local_398._0_8_ = local_428._0_8_;
                  local_398.z = local_428.z;
                  aVar32 = ::operator*(t1.z,(aiVector3t<float> *)&local_348);
                  local_438.z = aVar32.z;
                  local_438._0_8_ = aVar32._0_8_;
                  aVar32 = ::operator+(&local_398,&local_438);
                  local_380 = aVar32.z;
                  local_388 = aVar32._0_8_;
                  *(float *)(pdVar1 + 2) = local_380;
                  pdVar1[1] = local_388;
                  *pdVar1 = (double)(uint)key_2._4_4_;
                  local_348 = local_388;
                  t2.x = local_380;
                }
              }
            }
            if (dummy != (aiNode *)0x0) {
              std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                        (anims,(value_type *)&dummy);
              it._M_node._4_4_ = it._M_node._4_4_ + 1;
            }
          }
          std::_List_iterator<Assimp::IRRImporter::Animator>::operator++(&local_50);
        }
      }
    }
    return;
  }
  __assert_fail("nullptr != root && nullptr != real",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Irr/IRRLoader.cpp"
                ,0x137,
                "void Assimp::IRRImporter::ComputeAnimations(Node *, aiNode *, std::vector<aiNodeAnim *> &)"
               );
}

Assistant:

void IRRImporter::ComputeAnimations(Node* root, aiNode* real, std::vector<aiNodeAnim*>& anims)
{
    ai_assert(nullptr != root && nullptr != real);

    // XXX totally WIP - doesn't produce proper results, need to evaluate
    // whether there's any use for Irrlicht's proprietary scene format
    // outside Irrlicht ...
    // This also applies to the above function of FindSuitableMultiple and ClampSpline which are
    // solely used in this function

    if (root->animators.empty()) {
        return;
    }
    unsigned int total( 0 );
    for (std::list<Animator>::iterator it = root->animators.begin();it != root->animators.end(); ++it)  {
        if ((*it).type == Animator::UNKNOWN || (*it).type == Animator::OTHER)   {
            ASSIMP_LOG_WARN("IRR: Skipping unknown or unsupported animator");
            continue;
        }
        ++total;
    }
    if (!total) {
        return;
    } else if (1 == total)    {
        ASSIMP_LOG_WARN("IRR: Adding dummy nodes to simulate multiple animators");
    }

    // NOTE: 1 tick == i millisecond

    unsigned int cur = 0;
    for (std::list<Animator>::iterator it = root->animators.begin();
        it != root->animators.end(); ++it)
    {
        if ((*it).type == Animator::UNKNOWN || (*it).type == Animator::OTHER)continue;

        Animator& in = *it ;
        aiNodeAnim* anim = new aiNodeAnim();

        if (cur != total-1) {
            // Build a new name - a prefix instead of a suffix because it is
            // easier to check against
            anim->mNodeName.length = ::ai_snprintf(anim->mNodeName.data, MAXLEN,
                "$INST_DUMMY_%i_%s",total-1,
                (root->name.length() ? root->name.c_str() : ""));

            // we'll also need to insert a dummy in the node hierarchy.
            aiNode* dummy = new aiNode();

            for (unsigned int i = 0; i < real->mParent->mNumChildren;++i)
                if (real->mParent->mChildren[i] == real)
                    real->mParent->mChildren[i] = dummy;

            dummy->mParent = real->mParent;
            dummy->mName = anim->mNodeName;

            dummy->mNumChildren = 1;
            dummy->mChildren = new aiNode*[dummy->mNumChildren];
            dummy->mChildren[0] = real;

            // the transformation matrix of the dummy node is the identity

            real->mParent = dummy;
        }
        else anim->mNodeName.Set(root->name);
        ++cur;

        switch (in.type)    {
        case Animator::ROTATION:
            {
                // -----------------------------------------------------
                // find out how long a full rotation will take
                // This is the least common multiple of 360.f and all
                // three euler angles. Although we'll surely find a
                // possible multiple (haha) it could be somewhat large
                // for our purposes. So we need to modify the angles
                // here in order to get good results.
                // -----------------------------------------------------
                int angles[3];
                angles[0] = (int)(in.direction.x*100);
                angles[1] = (int)(in.direction.y*100);
                angles[2] = (int)(in.direction.z*100);

                angles[0] %= 360;
                angles[1] %= 360;
                angles[2] %= 360;

                if ( (angles[0]*angles[1]) != 0 && (angles[1]*angles[2]) != 0 )
                {
                    FindSuitableMultiple(angles[0]);
                    FindSuitableMultiple(angles[1]);
                    FindSuitableMultiple(angles[2]);
                }

                int lcm = 360;

                if (angles[0])
                    lcm  = Math::lcm(lcm,angles[0]);

                if (angles[1])
                    lcm  = Math::lcm(lcm,angles[1]);

                if (angles[2])
                    lcm  = Math::lcm(lcm,angles[2]);

                if (360 == lcm)
                    break;

#if 0
                // This can be a division through zero, but we don't care
                float f1 = (float)lcm / angles[0];
                float f2 = (float)lcm / angles[1];
                float f3 = (float)lcm / angles[2];
#endif

                // find out how many time units we'll need for the finest
                // track (in seconds) - this defines the number of output
                // keys (fps * seconds)
                float max  = 0.f;
                if (angles[0])
                    max = (float)lcm / angles[0];
                if (angles[1])
                    max = std::max(max, (float)lcm / angles[1]);
                if (angles[2])
                    max = std::max(max, (float)lcm / angles[2]);

                anim->mNumRotationKeys = (unsigned int)(max*fps);
                anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];

                // begin with a zero angle
                aiVector3D angle;
                for (unsigned int i = 0; i < anim->mNumRotationKeys;++i)
                {
                    // build the quaternion for the given euler angles
                    aiQuatKey& q = anim->mRotationKeys[i];

                    q.mValue = aiQuaternion(angle.x, angle.y, angle.z);
                    q.mTime = (double)i;

                    // increase the angle
                    angle += in.direction;
                }

                // This animation is repeated and repeated ...
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
            }
            break;

        case Animator::FLY_CIRCLE:
            {
                // -----------------------------------------------------
                // Find out how much time we'll need to perform a
                // full circle.
                // -----------------------------------------------------
                const double seconds = (1. / in.speed) / 1000.;
                const double tdelta = 1000. / fps;

                anim->mNumPositionKeys = (unsigned int) (fps * seconds);
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                // from Irrlicht, what else should we do than copying it?
                aiVector3D vecU,vecV;
                if (in.direction.y) {
                    vecV = aiVector3D(50,0,0) ^ in.direction;
                }
                else vecV = aiVector3D(0,50,00) ^ in.direction;
                vecV.Normalize();
                vecU = (vecV ^ in.direction).Normalize();

                // build the output keys
                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)    {
                    aiVectorKey& key = anim->mPositionKeys[i];
                    key.mTime = i * tdelta;

                    const ai_real t = (ai_real) ( in.speed * key.mTime );
                    key.mValue = in.circleCenter  + in.circleRadius * ((vecU * std::cos(t)) + (vecV * std::sin(t)));
                }

                // This animation is repeated and repeated ...
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
            }
            break;

        case Animator::FLY_STRAIGHT:
            {
                anim->mPostState = anim->mPreState = (in.loop ? aiAnimBehaviour_REPEAT : aiAnimBehaviour_CONSTANT);
                const double seconds = in.timeForWay / 1000.;
                const double tdelta = 1000. / fps;

                anim->mNumPositionKeys = (unsigned int) (fps * seconds);
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                aiVector3D diff = in.direction - in.circleCenter;
                const ai_real lengthOfWay = diff.Length();
                diff.Normalize();

                const double timeFactor = lengthOfWay / in.timeForWay;

                // build the output keys
                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)    {
                    aiVectorKey& key = anim->mPositionKeys[i];
                    key.mTime = i * tdelta;
                    key.mValue = in.circleCenter + diff * ai_real(timeFactor * key.mTime);
                }
            }
            break;

        case Animator::FOLLOW_SPLINE:
            {
                // repeat outside the defined time range
                anim->mPostState = anim->mPreState = aiAnimBehaviour_REPEAT;
                const int size = (int)in.splineKeys.size();
                if (!size)  {
                    // We have no point in the spline. That's bad. Really bad.
                    ASSIMP_LOG_WARN("IRR: Spline animators with no points defined");

                    delete anim;
                    anim = nullptr;
                    break;
                }
                else if (size == 1) {
                    // We have just one point in the spline so we don't need the full calculation
                    anim->mNumPositionKeys = 1;
                    anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                    anim->mPositionKeys[0].mValue = in.splineKeys[0].mValue;
                    anim->mPositionKeys[0].mTime  = 0.f;
                    break;
                }

                unsigned int ticksPerFull = 15;
                anim->mNumPositionKeys = (unsigned int) ( ticksPerFull * fps );
                anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];

                for (unsigned int i = 0; i < anim->mNumPositionKeys;++i)
                {
                    aiVectorKey& key = anim->mPositionKeys[i];

                    const ai_real dt = (i * in.speed * ai_real( 0.001 ) );
                    const ai_real u = dt - std::floor(dt);
                    const int idx = (int)std::floor(dt) % size;

                    // get the 4 current points to evaluate the spline
                    const aiVector3D& p0 = in.splineKeys[ ClampSpline( idx - 1, size ) ].mValue;
                    const aiVector3D& p1 = in.splineKeys[ ClampSpline( idx + 0, size ) ].mValue;
                    const aiVector3D& p2 = in.splineKeys[ ClampSpline( idx + 1, size ) ].mValue;
                    const aiVector3D& p3 = in.splineKeys[ ClampSpline( idx + 2, size ) ].mValue;

                    // compute polynomials
                    const ai_real u2 = u*u;
                    const ai_real u3 = u2*2;

                    const ai_real h1 = ai_real( 2.0 ) * u3 - ai_real( 3.0 ) * u2 + ai_real( 1.0 );
                    const ai_real h2 = ai_real( -2.0 ) * u3 + ai_real( 3.0 ) * u3;
                    const ai_real h3 = u3 - ai_real( 2.0 ) * u3;
                    const ai_real h4 = u3 - u2;

                    // compute the spline tangents
                    const aiVector3D t1 = ( p2 - p0 ) * in.tightness;
                    aiVector3D t2 = ( p3 - p1 ) * in.tightness;

                    // and use them to get the interpolated point
                    t2 = (h1 * p1 + p2 * h2 + t1 * h3 + h4 * t2);

                    // build a simple translation matrix from it
                    key.mValue = t2;
                    key.mTime  = (double) i;
                }
            }
            break;
        default:
            // UNKNOWN , OTHER
            break;
        };
        if (anim)   {
            anims.push_back(anim);
            ++total;
        }
    }
}